

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O1

int FFSconsume_next_item(FFSFile ffsfile)

{
  FFSRecordType FVar1;
  int iVar2;
  FFSBuffer p_Var3;
  
  FVar1 = next_record_type(ffsfile);
  iVar2 = 0;
  switch(FVar1 << 0x1e | FVar1 - FFSdata >> 2) {
  case 0:
    if (ffsfile->tmp_buffer == (FFSBuffer)0x0) {
      p_Var3 = create_FFSBuffer();
      ffsfile->tmp_buffer = p_Var3;
    }
    FFSread(ffsfile,(void *)0x0);
    break;
  case FFSerror:
    FFSread_format(ffsfile);
    break;
  default:
    goto switchD_00117d59_caseD_2;
  case FFSend|FFSerror:
    if (ffsfile->tmp_buffer == (FFSBuffer)0x0) {
      p_Var3 = create_FFSBuffer();
      ffsfile->tmp_buffer = p_Var3;
    }
    FFSread_comment(ffsfile);
    break;
  case FFSdata|FFSend|FFSerror:
    FFSread_index(ffsfile);
  }
  next_record_type(ffsfile);
  iVar2 = 1;
switchD_00117d59_caseD_2:
  return iVar2;
}

Assistant:

static int
FFSconsume_next_item(FFSFile ffsfile)
{
    switch(next_record_type(ffsfile)) {
    case FFScomment:
	if (ffsfile->tmp_buffer == NULL) {
	    ffsfile->tmp_buffer = create_FFSBuffer();
	}
	(void) FFSread_comment(ffsfile);
	(void) next_record_type(ffsfile);
	return 1;
    case FFSdata:
	if (ffsfile->tmp_buffer == NULL) {
	    ffsfile->tmp_buffer = create_FFSBuffer();
	}
	(void) FFSread(ffsfile, NULL);
	(void) next_record_type(ffsfile);
	return 1;
    case FFSformat:
	(void) FFSread_format(ffsfile);
	(void) next_record_type(ffsfile);
	return 1;
    case FFSindex:
	(void) FFSread_index(ffsfile);
	(void) next_record_type(ffsfile);
	return 1;
    default:
	return 0;
    }
}